

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfloat16.h
# Opt level: O2

bool qFuzzyCompare(qfloat16 p1,qfloat16 p2)

{
  undefined1 auVar1 [16];
  long in_FS_OFFSET;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar9 [16];
  float fVar10;
  qfloat16 local_14;
  qfloat16 local_12;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  fVar7 = qfloat16::operator_cast_to_float(&local_12);
  fVar8 = qfloat16::operator_cast_to_float(&local_14);
  fVar10 = fVar7 - fVar8;
  uVar2 = -(uint)(fVar10 < -fVar10);
  uVar3 = -(uint)(fVar7 < -fVar7);
  uVar4 = -(uint)(fVar8 < -fVar8);
  uVar5 = -(uint)(extraout_XMM0_Db < -extraout_XMM0_Db);
  uVar6 = -(uint)(extraout_XMM0_Db_00 < -extraout_XMM0_Db_00);
  auVar9._0_4_ = ~uVar3 & (uint)fVar7;
  auVar9._4_4_ = ~uVar4 & (uint)fVar8;
  auVar9._8_4_ = ~uVar5 & (uint)extraout_XMM0_Db;
  auVar9._12_4_ = ~uVar6 & (uint)extraout_XMM0_Db_00;
  auVar1._4_4_ = (uint)-fVar8 & uVar4;
  auVar1._0_4_ = (uint)-fVar7 & uVar3;
  auVar1._8_4_ = (uint)-extraout_XMM0_Db & uVar5;
  auVar1._12_4_ = (uint)-extraout_XMM0_Db_00 & uVar6;
  fVar7 = SUB164(auVar9 | auVar1,0);
  fVar8 = SUB164(auVar9 | auVar1,4);
  if (fVar8 <= fVar7) {
    fVar7 = fVar8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (float)(~uVar2 & (uint)fVar10 | (uint)-fVar10 & uVar2) * 102.5 <= fVar7;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] inline bool qFuzzyCompare(qfloat16 p1, qfloat16 p2) noexcept
{
    qfloat16::NearestFloat f1 = static_cast<qfloat16::NearestFloat>(p1);
    qfloat16::NearestFloat f2 = static_cast<qfloat16::NearestFloat>(p2);
    // The significand precision for IEEE754 half precision is
    // 11 bits (10 explicitly stored), or approximately 3 decimal
    // digits.  In selecting the fuzzy comparison factor of 102.5f
    // (that is, (2^10+1)/10) below, we effectively select a
    // window of about 1 (least significant) decimal digit about
    // which the two operands can vary and still return true.
    return (qAbs(f1 - f2) * 102.5f <= qMin(qAbs(f1), qAbs(f2)));
}